

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderCase.cpp
# Opt level: O0

void deqp::egl::getDefaultRenderFilterLists
               (vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
                *filterLists,FilterList *baseFilters)

{
  char *pcVar1;
  FilterList *pFVar2;
  undefined1 local_158 [8];
  RenderFilterList filters_1;
  RenderFilterList filters;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string name;
  int surfaceNdx;
  int colorNdx;
  FilterList *baseFilters_local;
  vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
  *filterLists_local;
  
  for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 5;
      name.field_2._12_4_ = name.field_2._12_4_ + 1) {
    for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < 3;
        name.field_2._8_4_ = name.field_2._8_4_ + 1) {
      pcVar1 = getDefaultRenderFilterLists::s_colorRules[(int)name.field_2._12_4_].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar1,&local_81);
      std::operator+(&local_60,&local_80,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     &local_60,
                     getDefaultRenderFilterLists::s_surfaceRules[(int)name.field_2._8_4_].name);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      pcVar1 = (char *)std::__cxx11::string::c_str();
      RenderFilterList::RenderFilterList
                ((RenderFilterList *)&filters_1.m_surfaceTypeMask,pcVar1,"",
                 getDefaultRenderFilterLists::s_surfaceRules[(int)name.field_2._8_4_].bits);
      pFVar2 = eglu::FilterList::operator<<((FilterList *)&filters_1.m_surfaceTypeMask,baseFilters);
      pFVar2 = eglu::FilterList::operator<<
                         (pFVar2,getDefaultRenderFilterLists::s_colorRules[(int)name.field_2._12_4_]
                                 .filter);
      pFVar2 = eglu::FilterList::operator<<
                         (pFVar2,getDefaultRenderFilterLists::s_surfaceRules
                                 [(int)name.field_2._8_4_].filter);
      eglu::FilterList::operator<<(pFVar2,isConformant);
      std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::
      push_back(filterLists,(value_type *)&filters_1.m_surfaceTypeMask);
      RenderFilterList::~RenderFilterList((RenderFilterList *)&filters_1.m_surfaceTypeMask);
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  RenderFilterList::RenderFilterList((RenderFilterList *)local_158,"other","",7);
  pFVar2 = eglu::FilterList::operator<<((FilterList *)local_158,baseFilters);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<5,6,5,0>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<8,8,8,0>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<4,4,4,4>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<5,5,5,1>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<8,8,8,8>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,isConformant);
  eglu::FilterList::operator<<(pFVar2,notFloat);
  std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::push_back
            (filterLists,(value_type *)local_158);
  RenderFilterList::~RenderFilterList((RenderFilterList *)local_158);
  return;
}

Assistant:

void getDefaultRenderFilterLists (vector<RenderFilterList>& filterLists, const eglu::FilterList& baseFilters)
{
	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_colorRules[] =
	{
		{ "rgb565",		colorBits<5, 6, 5, 0>	},
		{ "rgb888",		colorBits<8, 8, 8, 0>	},
		{ "rgba4444",	colorBits<4, 4, 4, 4>	},
		{ "rgba5551",	colorBits<5, 5, 5, 1>	},
		{ "rgba8888",	colorBits<8, 8, 8, 8>	},
	};

	static const struct
	{
		const char*			name;
		EGLint				bits;
		eglu::ConfigFilter	filter;
	} s_surfaceRules[] =
	{
		{ "window",		EGL_WINDOW_BIT,		surfaceType<EGL_WINDOW_BIT>		},
		{ "pixmap",		EGL_PIXMAP_BIT,		surfaceType<EGL_PIXMAP_BIT>,	},
		{ "pbuffer",	EGL_PBUFFER_BIT,	surfaceType<EGL_PBUFFER_BIT>	}
	};

	for (int colorNdx = 0; colorNdx < DE_LENGTH_OF_ARRAY(s_colorRules); colorNdx++)
	{
		for (int surfaceNdx = 0; surfaceNdx < DE_LENGTH_OF_ARRAY(s_surfaceRules); surfaceNdx++)
		{
			const string		name	= string(s_colorRules[colorNdx].name) + "_" + s_surfaceRules[surfaceNdx].name;
			RenderFilterList	filters	(name.c_str(), "", s_surfaceRules[surfaceNdx].bits);

			filters << baseFilters
					<< s_colorRules[colorNdx].filter
					<< s_surfaceRules[surfaceNdx].filter
					<< isConformant;

			filterLists.push_back(filters);
		}
	}

	// Add other config ids to "other" set
	{
		RenderFilterList	filters	("other", "", EGL_WINDOW_BIT|EGL_PIXMAP_BIT|EGL_PBUFFER_BIT);

		filters << baseFilters
				<< notColorBits<5, 6, 5, 0>
				<< notColorBits<8, 8, 8, 0>
				<< notColorBits<4, 4, 4, 4>
				<< notColorBits<5, 5, 5, 1>
				<< notColorBits<8, 8, 8, 8>
				<< isConformant
				<< notFloat;

		filterLists.push_back(filters);
	}
}